

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss.cpp
# Opt level: O0

void __thiscall edk2_vss_t::vss_variable_t::_read(vss_variable_t *this)

{
  string *psVar1;
  uint8_t uVar2;
  bool bVar3;
  int8_t iVar4;
  uint32_t uVar5;
  int iVar6;
  validation_expr_error<unsigned_char> *this_00;
  kstream *pkVar7;
  vss_variable_attributes_t *pvVar8;
  validation_expr_error<unsigned_int> *pvVar9;
  validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pvVar10;
  allocator local_291;
  string local_290;
  string local_270;
  undefined1 local_250 [8];
  string __5;
  allocator local_209;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [8];
  string __4;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  undefined1 local_102;
  allocator local_101;
  string local_100;
  uint32_t local_dc;
  uint32_t local_d8;
  undefined1 local_d2;
  allocator local_d1;
  uint32_t __3;
  uint32_t local_b0;
  uint32_t local_ac;
  undefined1 local_a8 [4];
  uint32_t __2;
  undefined1 local_82;
  allocator local_81;
  string local_80;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t __1;
  undefined1 local_4a;
  allocator local_49;
  string local_48;
  uint8_t local_12;
  uint8_t local_11;
  vss_variable_t *pvStack_10;
  uint8_t _;
  vss_variable_t *this_local;
  
  pvStack_10 = this;
  uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_signature_first = uVar2;
  this->n_signature_last = true;
  uVar2 = signature_first(this);
  if (uVar2 == 0xaa) {
    this->n_signature_last = false;
    uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_signature_last = uVar2;
    local_11 = signature_last(this);
    if (local_11 != 'U') {
      local_4a = 1;
      this_00 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
      local_12 = signature_last(this);
      pkVar7 = kaitai::kstruct::_io(&this->super_kstruct);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_48,"/types/vss_variable/seq/1",&local_49);
      kaitai::validation_expr_error<unsigned_char>::validation_expr_error
                (this_00,&local_12,pkVar7,&local_48);
      local_4a = 0;
      __cxa_throw(this_00,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
                  kaitai::validation_expr_error<unsigned_char>::~validation_expr_error);
    }
    local_11 = 0x55;
  }
  this->n_state = true;
  uVar2 = signature_first(this);
  if (uVar2 == 0xaa) {
    this->n_state = false;
    uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_state = uVar2;
  }
  this->n_reserved = true;
  uVar2 = signature_first(this);
  if (uVar2 == 0xaa) {
    this->n_reserved = false;
    uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_reserved = uVar2;
  }
  this->n_attributes = true;
  uVar2 = signature_first(this);
  if (uVar2 == 0xaa) {
    this->n_attributes = false;
    pvVar8 = (vss_variable_attributes_t *)operator_new(0x38);
    vss_variable_attributes_t::vss_variable_attributes_t
              (pvVar8,(this->super_kstruct).m__io,this,this->m__root);
    std::
    unique_ptr<edk2_vss_t::vss_variable_attributes_t,std::default_delete<edk2_vss_t::vss_variable_attributes_t>>
    ::unique_ptr<std::default_delete<edk2_vss_t::vss_variable_attributes_t>,void>
              ((unique_ptr<edk2_vss_t::vss_variable_attributes_t,std::default_delete<edk2_vss_t::vss_variable_attributes_t>>
                *)&stack0xffffffffffffffa8,pvVar8);
    std::
    unique_ptr<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
    ::operator=(&this->m_attributes,
                (unique_ptr<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
                 *)&stack0xffffffffffffffa8);
    std::
    unique_ptr<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
    ::~unique_ptr((unique_ptr<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
                   *)&stack0xffffffffffffffa8);
  }
  this->n_len_total = true;
  uVar2 = signature_first(this);
  if ((uVar2 == 0xaa) && (bVar3 = is_intel_legacy(this), bVar3)) {
    this->n_len_total = false;
    uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_total = uVar5;
    uVar5 = len_total(this);
    local_5c = uVar5;
    iVar4 = len_intel_legacy_header(this);
    if (uVar5 < (int)iVar4 + 5U) {
      local_82 = 1;
      pvVar9 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
      local_60 = len_total(this);
      pkVar7 = kaitai::kstruct::_io(&this->super_kstruct);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"/types/vss_variable/seq/5",&local_81);
      kaitai::validation_expr_error<unsigned_int>::validation_expr_error
                (pvVar9,&local_60,pkVar7,&local_80);
      local_82 = 0;
      __cxa_throw(pvVar9,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
                  kaitai::validation_expr_error<unsigned_int>::~validation_expr_error);
    }
  }
  this->n_len_name = true;
  uVar2 = signature_first(this);
  if ((uVar2 == 0xaa) && (bVar3 = is_intel_legacy(this), !bVar3)) {
    this->n_len_name = false;
    uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_name = uVar5;
  }
  this->n_len_data = true;
  uVar2 = signature_first(this);
  if ((uVar2 == 0xaa) && (bVar3 = is_intel_legacy(this), !bVar3)) {
    this->n_len_data = false;
    uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_data = uVar5;
  }
  this->n_timestamp = true;
  uVar2 = signature_first(this);
  if ((uVar2 == 0xaa) && (bVar3 = is_auth(this), bVar3)) {
    this->n_timestamp = false;
    kaitai::kstream::read_bytes_abi_cxx11_((string *)local_a8,(this->super_kstruct).m__io,0x10);
    std::__cxx11::string::operator=((string *)&this->m_timestamp,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
  }
  this->n_pubkey_index = true;
  uVar2 = signature_first(this);
  if ((uVar2 == 0xaa) && (bVar3 = is_auth(this), bVar3)) {
    this->n_pubkey_index = false;
    uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_pubkey_index = uVar5;
  }
  this->n_len_name_auth = true;
  uVar2 = signature_first(this);
  if ((uVar2 == 0xaa) && (bVar3 = is_auth(this), bVar3)) {
    this->n_len_name_auth = false;
    uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_name_auth = uVar5;
    local_ac = len_name_auth(this);
    if ((local_ac < 4) || (iVar6 = kaitai::kstream::mod(local_ac,2), iVar6 != 0)) {
      local_d2 = 1;
      pvVar9 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
      local_b0 = len_name_auth(this);
      pkVar7 = kaitai::kstruct::_io(&this->super_kstruct);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&__3,"/types/vss_variable/seq/10",&local_d1);
      kaitai::validation_expr_error<unsigned_int>::validation_expr_error
                (pvVar9,&local_b0,pkVar7,(string *)&__3);
      local_d2 = 0;
      __cxa_throw(pvVar9,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
                  kaitai::validation_expr_error<unsigned_int>::~validation_expr_error);
    }
  }
  this->n_len_data_auth = true;
  uVar2 = signature_first(this);
  if ((uVar2 == 0xaa) && (bVar3 = is_auth(this), bVar3)) {
    this->n_len_data_auth = false;
    uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_data_auth = uVar5;
    local_d8 = len_data_auth(this);
    if (local_d8 == 0) {
      local_102 = 1;
      pvVar9 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
      local_dc = len_data_auth(this);
      pkVar7 = kaitai::kstruct::_io(&this->super_kstruct);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_100,"/types/vss_variable/seq/11",&local_101);
      kaitai::validation_expr_error<unsigned_int>::validation_expr_error
                (pvVar9,&local_dc,pkVar7,&local_100);
      local_102 = 0;
      __cxa_throw(pvVar9,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
                  kaitai::validation_expr_error<unsigned_int>::~validation_expr_error);
    }
  }
  this->n_vendor_guid = true;
  uVar2 = signature_first(this);
  if (uVar2 == 0xaa) {
    this->n_vendor_guid = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_128,(this->super_kstruct).m__io,0x10);
    std::__cxx11::string::operator=((string *)&this->m_vendor_guid,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
  }
  this->n_name_auth = true;
  uVar2 = signature_first(this);
  if ((uVar2 == 0xaa) && (bVar3 = is_auth(this), bVar3)) {
    this->n_name_auth = false;
    pkVar7 = (this->super_kstruct).m__io;
    uVar5 = len_name_auth(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_148,pkVar7,(ulong)uVar5);
    std::__cxx11::string::operator=((string *)&this->m_name_auth,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
  }
  this->n_data_auth = true;
  uVar2 = signature_first(this);
  if ((uVar2 == 0xaa) && (bVar3 = is_auth(this), bVar3)) {
    this->n_data_auth = false;
    pkVar7 = (this->super_kstruct).m__io;
    uVar5 = len_data_auth(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_168,pkVar7,(ulong)uVar5);
    std::__cxx11::string::operator=((string *)&this->m_data_auth,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  this->n_apple_data_crc32 = true;
  uVar2 = signature_first(this);
  if (((uVar2 == 0xaa) && (bVar3 = is_intel_legacy(this), !bVar3)) &&
     (bVar3 = is_auth(this), !bVar3)) {
    pvVar8 = attributes(this);
    bVar3 = vss_variable_attributes_t::apple_data_checksum(pvVar8);
    if (bVar3) {
      this->n_apple_data_crc32 = false;
      uVar5 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
      this->m_apple_data_crc32 = uVar5;
    }
  }
  this->n_intel_legacy_data = true;
  uVar2 = signature_first(this);
  if ((uVar2 == 0xaa) && (bVar3 = is_intel_legacy(this), bVar3)) {
    this->n_intel_legacy_data = false;
    pkVar7 = (this->super_kstruct).m__io;
    uVar5 = len_total(this);
    iVar4 = len_intel_legacy_header(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_188,pkVar7,(ulong)(uVar5 - (int)iVar4));
    std::__cxx11::string::operator=((string *)&this->m_intel_legacy_data,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
  }
  this->n_name = true;
  uVar2 = signature_first(this);
  if (((uVar2 == 0xaa) && (bVar3 = is_intel_legacy(this), !bVar3)) &&
     (bVar3 = is_auth(this), !bVar3)) {
    this->n_name = false;
    pkVar7 = (this->super_kstruct).m__io;
    uVar5 = len_name(this);
    psVar1 = (string *)(__4.field_2._M_local_buf + 8);
    kaitai::kstream::read_bytes_abi_cxx11_(psVar1,pkVar7,(ulong)uVar5);
    std::__cxx11::string::operator=((string *)&this->m_name,(string *)psVar1);
    std::__cxx11::string::~string((string *)psVar1);
    name_abi_cxx11_((string *)local_1c8,this);
    uVar5 = len_name(this);
    if (3 < uVar5) {
      uVar5 = len_name(this);
      iVar6 = kaitai::kstream::mod(uVar5,2);
      if (iVar6 == 0) {
        std::__cxx11::string::~string((string *)local_1c8);
        goto LAB_0017eca5;
      }
    }
    pvVar10 = (validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)__cxa_allocate_exception(0x40);
    name_abi_cxx11_(&local_1e8,this);
    pkVar7 = kaitai::kstruct::_io(&this->super_kstruct);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"/types/vss_variable/seq/17",&local_209);
    kaitai::
    validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::validation_expr_error(pvVar10,&local_1e8,pkVar7,&local_208);
    __cxa_throw(pvVar10,&kaitai::validation_expr_error<std::__cxx11::string>::typeinfo,
                kaitai::
                validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~validation_expr_error);
  }
LAB_0017eca5:
  this->n_data = true;
  uVar2 = signature_first(this);
  if (((uVar2 == 0xaa) && (bVar3 = is_intel_legacy(this), !bVar3)) &&
     (bVar3 = is_auth(this), !bVar3)) {
    this->n_data = false;
    pkVar7 = (this->super_kstruct).m__io;
    uVar5 = len_data(this);
    psVar1 = (string *)(__5.field_2._M_local_buf + 8);
    kaitai::kstream::read_bytes_abi_cxx11_(psVar1,pkVar7,(ulong)uVar5);
    std::__cxx11::string::operator=((string *)&this->m_data,(string *)psVar1);
    std::__cxx11::string::~string((string *)psVar1);
    data_abi_cxx11_((string *)local_250,this);
    uVar5 = len_name(this);
    if (uVar5 == 0) {
      pvVar10 = (validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)__cxa_allocate_exception(0x40);
      data_abi_cxx11_(&local_270,this);
      pkVar7 = kaitai::kstruct::_io(&this->super_kstruct);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_290,"/types/vss_variable/seq/18",&local_291);
      kaitai::
      validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::validation_expr_error(pvVar10,&local_270,pkVar7,&local_290);
      __cxa_throw(pvVar10,&kaitai::validation_expr_error<std::__cxx11::string>::typeinfo,
                  kaitai::
                  validation_expr_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~validation_expr_error);
    }
    std::__cxx11::string::~string((string *)local_250);
  }
  return;
}

Assistant:

void edk2_vss_t::vss_variable_t::_read() {
    m_signature_first = m__io->read_u1();
    n_signature_last = true;
    if (signature_first() == 170) {
        n_signature_last = false;
        m_signature_last = m__io->read_u1();
        {
            uint8_t _ = signature_last();
            if (!(_ == 85)) {
                throw kaitai::validation_expr_error<uint8_t>(signature_last(), _io(), std::string("/types/vss_variable/seq/1"));
            }
        }
    }
    n_state = true;
    if (signature_first() == 170) {
        n_state = false;
        m_state = m__io->read_u1();
    }
    n_reserved = true;
    if (signature_first() == 170) {
        n_reserved = false;
        m_reserved = m__io->read_u1();
    }
    n_attributes = true;
    if (signature_first() == 170) {
        n_attributes = false;
        m_attributes = std::unique_ptr<vss_variable_attributes_t>(new vss_variable_attributes_t(m__io, this, m__root));
    }
    n_len_total = true;
    if ( ((signature_first() == 170) && (is_intel_legacy())) ) {
        n_len_total = false;
        m_len_total = m__io->read_u4le();
        {
            uint32_t _ = len_total();
            if (!(_ >= ((static_cast<uint32_t>(len_intel_legacy_header()) + 4) + 1))) {
                throw kaitai::validation_expr_error<uint32_t>(len_total(), _io(), std::string("/types/vss_variable/seq/5"));
            }
        }
    }
    n_len_name = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy()))) ) {
        n_len_name = false;
        m_len_name = m__io->read_u4le();
    }
    n_len_data = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy()))) ) {
        n_len_data = false;
        m_len_data = m__io->read_u4le();
    }
    n_timestamp = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_timestamp = false;
        m_timestamp = m__io->read_bytes(16);
    }
    n_pubkey_index = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_pubkey_index = false;
        m_pubkey_index = m__io->read_u4le();
    }
    n_len_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_name_auth = false;
        m_len_name_auth = m__io->read_u4le();
        {
            uint32_t _ = len_name_auth();
            if (!( ((_ >= 4) && (kaitai::kstream::mod(_, 2) == 0)) )) {
                throw kaitai::validation_expr_error<uint32_t>(len_name_auth(), _io(), std::string("/types/vss_variable/seq/10"));
            }
        }
    }
    n_len_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_data_auth = false;
        m_len_data_auth = m__io->read_u4le();
        {
            uint32_t _ = len_data_auth();
            if (!(_ > 0)) {
                throw kaitai::validation_expr_error<uint32_t>(len_data_auth(), _io(), std::string("/types/vss_variable/seq/11"));
            }
        }
    }
    n_vendor_guid = true;
    if (signature_first() == 170) {
        n_vendor_guid = false;
        m_vendor_guid = m__io->read_bytes(16);
    }
    n_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_name_auth = false;
        m_name_auth = m__io->read_bytes(len_name_auth());
    }
    n_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_data_auth = false;
        m_data_auth = m__io->read_bytes(len_data_auth());
    }
    n_apple_data_crc32 = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy())) && (!(is_auth())) && (attributes()->apple_data_checksum())) ) {
        n_apple_data_crc32 = false;
        m_apple_data_crc32 = m__io->read_u4le();
    }
    n_intel_legacy_data = true;
    if ( ((signature_first() == 170) && (is_intel_legacy())) ) {
        n_intel_legacy_data = false;
        m_intel_legacy_data = m__io->read_bytes((len_total() - len_intel_legacy_header()));
    }
    n_name = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy())) && (!(is_auth()))) ) {
        n_name = false;
        m_name = m__io->read_bytes(len_name());
        {
            std::string _ = name();
            if (!( ((len_name() >= 4) && (kaitai::kstream::mod(len_name(), 2) == 0)) )) {
                throw kaitai::validation_expr_error<std::string>(name(), _io(), std::string("/types/vss_variable/seq/17"));
            }
        }
    }
    n_data = true;
    if ( ((signature_first() == 170) && (!(is_intel_legacy())) && (!(is_auth()))) ) {
        n_data = false;
        m_data = m__io->read_bytes(len_data());
        {
            std::string _ = data();
            if (!(len_name() > 0)) {
                throw kaitai::validation_expr_error<std::string>(data(), _io(), std::string("/types/vss_variable/seq/18"));
            }
        }
    }
}